

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall KDIS::NETWORK::Connection::RemoveMulticastAddress(Connection *this,KString *A)

{
  int iVar1;
  KException *this_00;
  int *piVar2;
  KCHAR8 *__s;
  Connection *this_01;
  ip_mreq mc;
  allocator<char> local_41;
  KString local_40;
  in_addr_t local_20 [2];
  
  local_20[0] = inet_addr((this->m_sSendAddress)._M_dataplus._M_p);
  local_20[1] = 0;
  iVar1 = setsockopt(this->m_iSocket[1],0,0x24,local_20,8);
  if (iVar1 != -1) {
    return;
  }
  this_01 = (Connection *)0x30;
  this_00 = (KException *)__cxa_allocate_exception();
  piVar2 = __errno_location();
  __s = getErrorText(this_01,*piVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  KException::KException(this_00,&local_40,0xc);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Connection::RemoveMulticastAddress(const KString &A) noexcept(false)
{
    // Attempt to drop the address.
    ip_mreq mc;
    mc.imr_multiaddr.s_addr = inet_addr( m_sSendAddress.c_str() );
    mc.imr_interface.s_addr = htonl( INADDR_ANY );
    KINT32 iRet = setsockopt( m_iSocket[RECEIVE_SOCK], IPPROTO_IP, IP_DROP_MEMBERSHIP, ( KOCTET* )&mc, sizeof( mc ) );
    if( iRet == SOCKET_ERROR )
    {
        THROW_ERROR;
    }
}